

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_ratrecAndOrRatfac
          (SoPlexBase<double> *this,int *minIRRoundsRemaining,int *lastStallIterations,
          int *numberOfIterations,bool *factorSolNewBasis,int *nextRatrec,
          Rational *errorCorrectionFactor,Rational *errorCorrection,Rational *maxViolation,
          SolRational *sol,bool *primalFeasible,bool *dualFeasible,bool *stoppedTime,
          bool *stoppedIter,bool *error,bool *breakAfter,bool *continueAfter)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  Verbosity VVar4;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  SoPlexBase<double> *in_RDI;
  byte *in_R8;
  int *in_R9;
  Real RVar5;
  Rational *in_stack_00000008;
  undefined1 *in_stack_00000028;
  undefined1 *in_stack_00000030;
  byte *in_stack_00000038;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  byte *in_stack_00000048;
  Verbosity old_verbosity_3;
  bool optimal;
  undefined1 *in_stack_00000050;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool performRatrec;
  bool performRatfac;
  bool forcebasic;
  Rational *in_stack_000005d8;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_000005e0;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_000005e8;
  SolRational *in_stack_000005f0;
  SoPlexBase<double> *in_stack_000005f8;
  bool *in_stack_00000638;
  bool *in_stack_00000640;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000648;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000650;
  SolRational *in_stack_00000658;
  SoPlexBase<double> *in_stack_00000660;
  bool *in_stack_000008a0;
  bool *in_stack_000008a8;
  char *in_stack_ffffffffffffff58;
  byte *t;
  SPxOut *in_stack_ffffffffffffff60;
  SPxOut *_spxout;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 uVar6;
  byte bVar7;
  byte in_stack_ffffffffffffff7a;
  byte bVar8;
  int in_stack_ffffffffffffff7c;
  byte local_71;
  Verbosity local_70;
  Verbosity local_6c [3];
  Verbosity local_60;
  Verbosity local_5c;
  undefined1 local_55 [21];
  Verbosity local_40;
  Verbosity local_3c [2];
  byte local_33;
  byte local_32;
  byte local_31;
  int *local_30;
  byte *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  
  *in_stack_00000050 = 0;
  *_old_verbosity_2 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_31 = boolParam(in_RDI,FORCEBASIC);
  bVar1 = boolParam(in_RDI,RATFAC);
  local_71 = 0;
  if (bVar1) {
    in_stack_ffffffffffffff7c = *local_18;
    iVar3 = intParam(in_RDI,RATFAC_MINSTALLS);
    local_71 = 0;
    if ((iVar3 <= in_stack_ffffffffffffff7c) && (local_71 = 0, (in_RDI->_hasBasis & 1U) != 0)) {
      local_71 = *local_28;
    }
  }
  local_32 = local_71 & 1;
  bVar1 = boolParam(in_RDI,RATREC);
  bVar8 = 0;
  if ((bVar1) && (in_stack_ffffffffffffff7a = 1, bVar8 = 1, *local_20 < *local_30)) {
    in_stack_ffffffffffffff7a = local_32;
    bVar8 = local_32;
  }
  local_33 = bVar8 & 1;
  bVar7 = 1;
  if ((local_32 & 1) == 0) {
    bVar7 = local_31;
  }
  local_32 = bVar7 & 1;
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                *)in_RDI,
               (self_type *)
               CONCAT44(in_stack_ffffffffffffff7c,
                        CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff7a,
                                                CONCAT11(bVar7,in_stack_ffffffffffffff78)))));
  uVar6 = false;
  if ((local_33 & 1) != 0) {
    local_3c[1] = 0;
    uVar6 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                       (int *)in_stack_ffffffffffffff60);
  }
  if ((type_conflict5)uVar6 != false) {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
      local_3c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_40 = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_40);
      soplex::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      SPxOut::setVerbosity(&in_RDI->spxout,local_3c);
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_RDI,
                 (self_type *)
                 CONCAT44(in_stack_ffffffffffffff7c,
                          CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff7a,CONCAT11(bVar7,uVar6))))
                );
    invert(in_stack_00000008);
    bVar1 = _reconstructSolutionRational
                      (in_stack_000005f8,in_stack_000005f0,in_stack_000005e8,in_stack_000005e0,
                       in_stack_000005d8);
    if (bVar1) {
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
        local_55._17_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
        local_55._13_4_ = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_55 + 0xd));
        soplex::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_55 + 0x11));
      }
      *in_stack_00000028 = 1;
      *in_stack_00000030 = 1;
      if (((in_RDI->_hasBasis & 1U) != 0) || ((local_31 & 1) == 0)) {
        *in_stack_00000050 = 1;
        return;
      }
    }
    iVar3 = *local_20;
    RVar5 = realParam(in_RDI,RATREC_FREQ);
    *local_30 = (int)((double)iVar3 * RVar5) + 1;
    bVar1 = boolParam(in_RDI,ITERATIVE_REFINEMENT);
    if (bVar1) {
      SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[51],_int_&,_0>
                (in_RDI,(char (*) [51])"Next rational reconstruction after refinement {}.\n",
                 local_30);
    }
    else {
      SPxOut::debug<soplex::SoPlexBase<double>,_const_char_(&)[56],_int_&,_0>
                (in_RDI,(char (*) [56])"Next rational reconstruction after precision boost {} \n",
                 local_30);
    }
  }
  if ((local_32 & 1) != 0) {
    local_55._9_4_ = 0;
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                       (int *)in_stack_ffffffffffffff60);
    bVar8 = 1;
    if (tVar2) goto LAB_0046caaa;
  }
  bVar8 = 0;
  if ((in_RDI->_hasBasis & 1U) == 0) {
    bVar8 = local_31;
  }
LAB_0046caaa:
  if ((bVar8 & 1) != 0) {
    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
       (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
      local_55._5_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
      local_55._1_4_ = 3;
      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_55 + 1));
      soplex::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)(local_55 + 5));
    }
    _spxout = (SPxOut *)local_55;
    t = in_stack_00000048;
    factorizeColumnRational
              (in_stack_00000660,in_stack_00000658,in_stack_00000650,in_stack_00000648,
               in_stack_00000640,in_stack_00000638,in_stack_000008a0,in_stack_000008a8);
    *local_28 = 0;
    if ((*in_stack_00000038 & 1) == 0) {
      if ((*in_stack_00000048 & 1) == 0) {
        if ((local_55[0] & 1) == 0) {
          bVar1 = boolParam(in_RDI,RATFACJUMP);
          if (bVar1) {
            if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
               (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
              local_6c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
              local_70 = INFO1;
              SPxOut::setVerbosity(&in_RDI->spxout,&local_70);
              soplex::operator<<(_spxout,(char *)t);
              SPxOut::setVerbosity(&in_RDI->spxout,local_6c);
            }
            *local_10 = *local_10 + 1;
            *_old_verbosity_2 = 1;
          }
        }
        else {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
            local_6c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_6c[1] = 3;
            SPxOut::setVerbosity(&in_RDI->spxout,local_6c + 1);
            soplex::operator<<(_spxout,(char *)t);
            SPxOut::setVerbosity(&in_RDI->spxout,local_6c + 2);
          }
          *in_stack_00000028 = 1;
          *in_stack_00000030 = 1;
          *in_stack_00000050 = 1;
        }
      }
      else {
        *in_stack_00000048 = 0;
      }
    }
    else if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
            (VVar4 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar4)) {
      local_5c = SPxOut::getVerbosity(&in_RDI->spxout);
      local_60 = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_60);
      soplex::operator<<(_spxout,(char *)t);
      SPxOut::setVerbosity(&in_RDI->spxout,&local_5c);
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_ratrecAndOrRatfac(
   int& minIRRoundsRemaining,
   int& lastStallIterations,
   int& numberOfIterations,
   bool& factorSolNewBasis,
   int& nextRatrec,
   const Rational& errorCorrectionFactor,
   Rational& errorCorrection,
   Rational& maxViolation,
   SolRational& sol,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error,
   bool& breakAfter,
   bool& continueAfter)
{

   ///@todo precision-boosting numberOfIterations is not the best name
   // It is supposed to designate either the number of refinements (when we use iterative refinement) or
   // the number of precision boosts (when not using iterative refinement)
   // numberOfSpecificIterations maybe?

   breakAfter    = false;
   continueAfter = false;

   // decide whether to perform rational reconstruction and/or factorization
   bool forcebasic    = boolParam(SoPlexBase<R>::FORCEBASIC);
   bool performRatfac = boolParam(SoPlexBase<R>::RATFAC)
                        && lastStallIterations >= intParam(SoPlexBase<R>::RATFAC_MINSTALLS) && _hasBasis
                        && factorSolNewBasis;
   bool performRatrec = boolParam(SoPlexBase<R>::RATREC)
                        && (numberOfIterations >= nextRatrec || performRatfac);

   // if we want to force the solution to be basic we need to turn rational factorization on
   performRatfac = performRatfac || forcebasic;

   // attempt rational reconstruction
   errorCorrection *= errorCorrectionFactor;

   if(performRatrec && maxViolation > 0)
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational reconstruction . . .\n");

      maxViolation *= errorCorrection; // only used for sign check later
      invert(maxViolation);

      if(_reconstructSolutionRational(sol, _basisStatusRows, _basisStatusCols, maxViolation))
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;

         if(_hasBasis || !forcebasic)
         {
            breakAfter = true;
            return;
         }
      }

      nextRatrec = int(numberOfIterations * realParam(SoPlexBase<R>::RATREC_FREQ)) + 1;

      if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
      {
         SPxOut::debug(this, "Next rational reconstruction after refinement {}.\n", nextRatrec);
      }
      else
      {
         assert(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
         SPxOut::debug(this, "Next rational reconstruction after precision boost {} \n", nextRatrec);
      }
   }

   // solve basis systems exactly
   if((performRatfac && maxViolation > 0) || (!_hasBasis && forcebasic))
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational factorization . . .\n");

      bool optimal;
      factorizeColumnRational(sol, _basisStatusRows, _basisStatusCols, stoppedTime, stoppedIter, error,
                              optimal);
      factorSolNewBasis = false;

      if(stoppedTime)
      {
         SPX_MSG_INFO1(spxout, spxout << "Stopped rational factorization.\n");
      }
      else if(error)
      {
         // message was already printed; reset error flag and continue without factorization
         error = false;
      }
      else if(optimal)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;
         breakAfter = true;
         return;
      }
      else if(boolParam(SoPlexBase<R>::RATFACJUMP))
      {
         SPX_MSG_INFO1(spxout, spxout << "Jumping to exact basic solution.\n");
         minIRRoundsRemaining++;
         continueAfter = true;
         return;
      }
   }
}